

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void Js::InterpreterStackFrame::TraceAsmJsOpCode(InterpreterStackFrame *that,OpCodeAsmJs op)

{
  uint uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  char16 *pcVar7;
  
  uVar5 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  lVar2 = *(long *)(that + 0x88);
  if (*(long *)(lVar2 + 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_0099a218;
    *puVar6 = 0;
  }
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015cd718,AsmjsInterpreterPhase,uVar5,
                            *(LocalFunctionId *)(*(long *)(lVar2 + 0x10) + 0x10));
  if (!bVar4) {
    return;
  }
  uVar5 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  lVar2 = *(long *)(that + 0x88);
  if (*(long *)(lVar2 + 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
LAB_0099a218:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  uVar1 = *(uint *)(*(long *)(lVar2 + 0x10) + 0x10);
  pcVar7 = OpCodeUtilAsmJs::GetOpCodeName(op);
  Output::Print(L"%d.%d:Executing %s at offset 0x%X\n",(ulong)uVar5,(ulong)uVar1,pcVar7,
                *(undefined8 *)(that + 0x108));
  return;
}

Assistant:

void InterpreterStackFrame::TraceAsmJsOpCode(InterpreterStackFrame* that, Js::OpCodeAsmJs op)
    {
#if DBG_DUMP && defined(ASMJS_PLAT)
        if (PHASE_TRACE(Js::AsmjsInterpreterPhase, that->m_functionBody))
        {
            Output::Print(_u("%d.%d:Executing %s at offset 0x%X\n"), that->m_functionBody->GetSourceContextId(), that->m_functionBody->GetLocalFunctionId(), Js::OpCodeUtilAsmJs::GetOpCodeName(op), that->DEBUG_currentByteOffset);
        }
#endif
    }